

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O0

void __thiscall AI::Task::addSubtask(Task *this,Task *task)

{
  bool bVar1;
  reference pvVar2;
  Task *task_local;
  Task *this_local;
  
  bVar1 = std::vector<AI::Task,_std::allocator<AI::Task>_>::empty(&this->subtasks);
  if (!bVar1) {
    pvVar2 = std::vector<AI::Task,_std::allocator<AI::Task>_>::back(&this->subtasks);
    pvVar2->isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(&this->subtasks,task);
  pvVar2 = std::vector<AI::Task,_std::allocator<AI::Task>_>::back(&this->subtasks);
  pvVar2->isLastInCompound = true;
  return;
}

Assistant:

void Task::addSubtask(Task& task)
	{
		if (!subtasks.empty())
		{
			subtasks.back().isLastInCompound = false;
		}

		subtasks.push_back(task);
		subtasks.back().isLastInCompound = true;
	}